

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSweep.c
# Opt level: O3

int Abc_NtkSweep(Abc_Ntk_t *pNtk,int fVerbose)

{
  Abc_Obj_t *pAVar1;
  Abc_Obj_t *pAVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint *__ptr;
  void *pvVar6;
  void *pvVar7;
  Abc_Obj_t *pAVar8;
  Vec_Ptr_t *pVVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  ulong local_50;
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSweep.c"
                  ,0x263,"int Abc_NtkSweep(Abc_Ntk_t *, int)");
  }
  iVar3 = Abc_NtkToBdd(pNtk);
  if (iVar3 == 0) {
    fwrite("Converting to BDD has failed.\n",0x1e,1,_stdout);
    iVar3 = 1;
  }
  else {
    iVar3 = pNtk->nObjCounts[7];
    uVar12 = 0;
    Abc_NtkCleanup(pNtk,0);
    Abc_NtkRemoveDupFanins(pNtk);
    Abc_NtkMinimumBase(pNtk);
    __ptr = (uint *)malloc(0x10);
    __ptr[0] = 100;
    __ptr[1] = 0;
    pvVar6 = malloc(800);
    *(void **)(__ptr + 2) = pvVar6;
    pVVar9 = pNtk->vObjs;
    if (0 < pVVar9->nSize) {
      local_50 = 100;
      lVar11 = 0;
      do {
        pvVar6 = pVVar9->pArray[lVar11];
        if (((pvVar6 != (void *)0x0) && ((*(uint *)((long)pvVar6 + 0x14) & 0xf) == 7)) &&
           (*(int *)((long)pvVar6 + 0x1c) < 2)) {
          uVar4 = (uint)local_50;
          if (uVar12 == uVar4) {
            if ((int)uVar4 < 0x10) {
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar7 = malloc(0x80);
              }
              else {
                pvVar7 = realloc(*(void **)(__ptr + 2),0x80);
              }
              *(void **)(__ptr + 2) = pvVar7;
              *__ptr = 0x10;
              local_50 = 0x10;
            }
            else {
              local_50 = (ulong)(uVar4 * 2);
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar7 = malloc(local_50 * 8);
              }
              else {
                pvVar7 = realloc(*(void **)(__ptr + 2),local_50 * 8);
              }
              *(void **)(__ptr + 2) = pvVar7;
              *__ptr = uVar4 * 2;
            }
          }
          else {
            pvVar7 = *(void **)(__ptr + 2);
          }
          lVar10 = (long)(int)uVar12;
          uVar12 = uVar12 + 1;
          __ptr[1] = uVar12;
          *(void **)((long)pvVar7 + lVar10 * 8) = pvVar6;
          pVVar9 = pNtk->vObjs;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < pVVar9->nSize);
      while (uVar4 = uVar12, 0 < (int)uVar4) {
        pvVar6 = *(void **)(__ptr + 2);
        uVar12 = uVar4 - 1;
        pAVar1 = *(Abc_Obj_t **)((long)pvVar6 + (ulong)uVar12 * 8);
        if (((*(uint *)&pAVar1->field_0x14 & 0xf) == 7) &&
           (pAVar8 = Abc_NodeFindNonCoFanout(pAVar1), pAVar8 != (Abc_Obj_t *)0x0)) {
          if ((*(uint *)&pAVar8->field_0x14 & 0xf) != 7) {
            __assert_fail("Abc_ObjIsNode(pFanout)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSweep.c"
                          ,0x280,"int Abc_NtkSweep(Abc_Ntk_t *, int)");
          }
          iVar5 = (pAVar1->vFanins).nSize;
          if (iVar5 == 1) {
            pAVar2 = (Abc_Obj_t *)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanins).pArray];
            iVar5 = Abc_NodeIsInv(pAVar1);
            if (iVar5 != 0) {
              Abc_NodeComplementInput(pAVar8,pAVar1);
            }
            Abc_ObjPatchFanin(pAVar8,pAVar1,pAVar2);
          }
          else {
            if (iVar5 != 0) {
              __assert_fail("Abc_ObjFaninNum(pNode) == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSweep.c"
                            ,0x286,"int Abc_NtkSweep(Abc_Ntk_t *, int)");
            }
            iVar5 = Abc_NodeIsConst0(pAVar1);
            Abc_NodeConstantInput(pAVar8,pAVar1,iVar5);
          }
          Abc_NodeRemoveDupFanins(pAVar8);
          Abc_NodeMinimumBase(pAVar8);
          if ((pAVar8->vFanins).nSize < 2) {
            if (uVar12 == (uint)local_50) {
              if (uVar4 < 0x11) {
                pvVar6 = realloc(pvVar6,0x80);
                local_50 = 0x10;
              }
              else {
                local_50 = (ulong)((uint)local_50 * 2);
                pvVar6 = realloc(pvVar6,local_50 * 8);
              }
              *(void **)(__ptr + 2) = pvVar6;
              *__ptr = (uint)local_50;
            }
            *(Abc_Obj_t **)((long)pvVar6 + (ulong)uVar12 * 8) = pAVar8;
            uVar12 = uVar4;
          }
          if ((pAVar1->vFanouts).nSize < 1) {
            Abc_NtkDeleteObj_rec(pAVar1,1);
          }
          else {
            uVar4 = (uint)local_50;
            if (uVar12 == uVar4) {
              if (uVar4 < 0x10) {
                pvVar6 = realloc(pvVar6,0x80);
                local_50 = 0x10;
              }
              else {
                local_50 = (ulong)(uVar4 * 2);
                pvVar6 = realloc(pvVar6,local_50 * 8);
              }
              *(void **)(__ptr + 2) = pvVar6;
              *__ptr = (uint)local_50;
            }
            *(Abc_Obj_t **)((long)pvVar6 + (ulong)uVar12 * 8) = pAVar1;
            uVar12 = uVar12 + 1;
          }
        }
      }
    }
    if (*(void **)(__ptr + 2) != (void *)0x0) {
      free(*(void **)(__ptr + 2));
    }
    free(__ptr);
    pVVar9 = pNtk->vCos;
    if (0 < pVVar9->nSize) {
      lVar11 = 0;
      do {
        pAVar1 = (Abc_Obj_t *)pVVar9->pArray[lVar11];
        pAVar8 = (Abc_Obj_t *)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanins).pArray];
        if ((((pAVar8->vFanins).nSize == 1) &&
            (pAVar2 = (Abc_Obj_t *)pAVar8->pNtk->vObjs->pArray[*(pAVar8->vFanins).pArray],
            (pAVar2->vFanouts).nSize == 1)) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) {
          iVar5 = Abc_NodeIsInv(pAVar8);
          if (iVar5 != 0) {
            *(byte *)&pAVar2->field_5 = *(byte *)&pAVar2->field_5 ^ 1;
          }
          Abc_ObjPatchFanin(pAVar1,pAVar8,pAVar2);
          pVVar9 = pNtk->vCos;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < pVVar9->nSize);
    }
    Abc_NtkCleanup(pNtk,0);
    if (fVerbose != 0) {
      printf("Sweep removed %d nodes.\n",(ulong)(uint)(iVar3 - pNtk->nObjCounts[7]));
    }
    iVar3 = iVar3 - pNtk->nObjCounts[7];
  }
  return iVar3;
}

Assistant:

int Abc_NtkSweep( Abc_Ntk_t * pNtk, int fVerbose )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode, * pFanout, * pDriver;
    int i, nNodesOld;
    assert( Abc_NtkIsLogic(pNtk) ); 
    // convert network to BDD representation
    if ( !Abc_NtkToBdd(pNtk) )
    {
        fprintf( stdout, "Converting to BDD has failed.\n" );
        return 1;
    }
    // perform cleanup
    nNodesOld = Abc_NtkNodeNum(pNtk);
    Abc_NtkCleanup( pNtk, 0 );
    // prepare nodes for sweeping
    Abc_NtkRemoveDupFanins(pNtk);
    Abc_NtkMinimumBase(pNtk);
    // collect sweepable nodes
    vNodes = Vec_PtrAlloc( 100 );
    Abc_NtkForEachNode( pNtk, pNode, i )
        if ( Abc_ObjFaninNum(pNode) < 2 )
            Vec_PtrPush( vNodes, pNode );
    // sweep the nodes
    while ( Vec_PtrSize(vNodes) > 0 )
    {
        // get any sweepable node
        pNode = (Abc_Obj_t *)Vec_PtrPop(vNodes);
        if ( !Abc_ObjIsNode(pNode) )
            continue;
        // get any non-CO fanout of this node
        pFanout = Abc_NodeFindNonCoFanout(pNode);
        if ( pFanout == NULL )
            continue;
        assert( Abc_ObjIsNode(pFanout) );
        // transform the function of the fanout
        if ( Abc_ObjFaninNum(pNode) == 0 )
            Abc_NodeConstantInput( pFanout, pNode, Abc_NodeIsConst0(pNode) );
        else 
        {
            assert( Abc_ObjFaninNum(pNode) == 1 );
            pDriver = Abc_ObjFanin0(pNode);
            if ( Abc_NodeIsInv(pNode) )
                Abc_NodeComplementInput( pFanout, pNode );
            Abc_ObjPatchFanin( pFanout, pNode, pDriver );
        }
        Abc_NodeRemoveDupFanins( pFanout );
        Abc_NodeMinimumBase( pFanout );
        // check if the fanout should be added
        if ( Abc_ObjFaninNum(pFanout) < 2 )
            Vec_PtrPush( vNodes, pFanout );
        // check if the node has other fanouts
        if ( Abc_ObjFanoutNum(pNode) > 0 )
            Vec_PtrPush( vNodes, pNode );
        else
            Abc_NtkDeleteObj_rec( pNode, 1 );
    }
    Vec_PtrFree( vNodes );
    // sweep a node into its CO fanout if all of this is true:
    // (a) this node is a single-input node
    // (b) the driver of the node has only one fanout (this node)
    // (c) the driver is a node
    Abc_NtkForEachCo( pNtk, pFanout, i )
    {
        pNode = Abc_ObjFanin0(pFanout);
        if ( Abc_ObjFaninNum(pNode) != 1 )
            continue;
        pDriver = Abc_ObjFanin0(pNode);
        if ( !(Abc_ObjFanoutNum(pDriver) == 1 && Abc_ObjIsNode(pDriver)) )
            continue;
        // trasform this CO
        if ( Abc_NodeIsInv(pNode) )
            pDriver->pData = Cudd_Not(pDriver->pData);
        Abc_ObjPatchFanin( pFanout, pNode, pDriver );
    }
    // perform cleanup
    Abc_NtkCleanup( pNtk, 0 );
    // report
    if ( fVerbose )
        printf( "Sweep removed %d nodes.\n", nNodesOld - Abc_NtkNodeNum(pNtk) );
    return nNodesOld - Abc_NtkNodeNum(pNtk);
}